

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

dht_state * __thiscall
libtorrent::dht::dht_tracker::state(dht_state *__return_storage_ptr__,dht_tracker *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  nodes;
  data_union local_78;
  undefined1 *local_58;
  undefined1 auStack_50 [16];
  code *pcStack_40;
  
  (__return_storage_ptr__->nodes6).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nodes6).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nids).
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nids).
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nids).
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nodes6).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      aux::listen_socket_handle::get_local_endpoint
                ((endpoint *)&local_78.base,(listen_socket_handle *)(p_Var1 + 1));
      if (local_78.base.sa_family == 2) {
        local_58 = (undefined1 *)(local_78._0_8_ & 0xffffffff00000000);
        auStack_50[0] = '\0';
        auStack_50[1] = '\0';
        auStack_50[2] = '\0';
        auStack_50[3] = '\0';
        auStack_50[4] = '\0';
        auStack_50[5] = '\0';
        auStack_50[6] = '\0';
        auStack_50[7] = '\0';
        auStack_50._8_8_ = 0;
        pcStack_40 = (code *)0x0;
      }
      else {
        auStack_50[0] = local_78.base.sa_data[6];
        auStack_50[1] = local_78.base.sa_data[7];
        auStack_50[2] = local_78.base.sa_data[8];
        auStack_50[3] = local_78.base.sa_data[9];
        auStack_50[4] = local_78.base.sa_data[10];
        auStack_50[5] = local_78.base.sa_data[0xb];
        auStack_50[6] = local_78.base.sa_data[0xc];
        auStack_50[7] = local_78.base.sa_data[0xd];
        auStack_50._8_8_ = local_78._16_8_;
        pcStack_40 = (code *)(ulong)local_78.v6.sin6_scope_id;
        local_58 = (undefined1 *)0x1;
      }
      ::std::
      vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
      ::emplace_back<boost::asio::ip::address,libtorrent::digest32<160l>const&>
                ((vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
                  *)__return_storage_ptr__,(address *)&local_58,(digest32<160L> *)&p_Var1[4]._M_left
                );
      local_78._0_8_ = (void *)0x0;
      local_78.base.sa_data[6] = '\0';
      local_78.base.sa_data[7] = '\0';
      local_78.base.sa_data[8] = '\0';
      local_78.base.sa_data[9] = '\0';
      local_78.base.sa_data[10] = '\0';
      local_78.base.sa_data[0xb] = '\0';
      local_78.base.sa_data[0xc] = '\0';
      local_78.base.sa_data[0xd] = '\0';
      local_78._16_8_ = 0;
      auStack_50._0_8_ = 0;
      pcStack_40 = ::std::
                   _Function_handler<void_(const_libtorrent::dht::node_entry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/kademlia/dht_tracker.cpp:587:29)>
                   ::_M_invoke;
      auStack_50._8_8_ =
           ::std::
           _Function_handler<void_(const_libtorrent::dht::node_entry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/kademlia/dht_tracker.cpp:587:29)>
           ::_M_manager;
      local_58 = (undefined1 *)&local_78;
      routing_table::for_each_node
                ((routing_table *)&p_Var1[5]._M_parent,
                 (function<void_(const_libtorrent::dht::node_entry_&)> *)&local_58);
      if ((code *)auStack_50._8_8_ != (code *)0x0) {
        (*(code *)auStack_50._8_8_)((address *)&local_58,(address *)&local_58,3);
      }
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>>
                ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
                  *)&__return_storage_ptr__->nodes,
                 (__return_storage_ptr__->nodes).
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,local_78._0_8_,local_78.v4.sin_zero);
      if ((void *)local_78._0_8_ != (void *)0x0) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
      }
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return __return_storage_ptr__;
}

Assistant:

dht_state dht_tracker::state() const
	{
		dht_state ret;
		for (auto const& n : m_nodes)
		{
			// use the local rather than external address because if the user is behind NAT
			// we won't know the external IP on startup
			ret.nids.emplace_back(n.first.get_local_endpoint().address(), n.second.dht.nid());
			auto nodes = save_nodes(n.second.dht);
			ret.nodes.insert(ret.nodes.end(), nodes.begin(), nodes.end());
		}
		return ret;
	}